

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_begin_end_forward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_forward_Test *this)

{
  IntrusiveListIteratorTest *this_00;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined8 *puVar4;
  TestObject *pTVar5;
  char *pcVar6;
  vector<int,_std::allocator<int>_> *in_R9;
  const_iterator first;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  unsigned_long local_60;
  undefined8 *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  IntrusiveListIteratorTest_begin_end_forward_Test *local_40;
  AssertHelper local_38;
  
  pTVar5 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_40 = this;
  puVar4 = (undefined8 *)operator_new(0xc);
  *puVar4 = &DAT_200000001;
  *(undefined4 *)(puVar4 + 1) = 3;
  local_60 = 0;
  if (pTVar5 != (TestObject *)0x0) {
    do {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"expected[count]","first->data",
                 (int *)((long)puVar4 + local_60 * 4),&pTVar5->data);
      if (local_58._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        if (sStack_50.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((sStack_50.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
                   ,0xa2,pcVar6);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_68.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_68.ptr_ + 8))();
          }
          local_68.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        goto LAB_001e1491;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pTVar5 = (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      local_60 = local_60 + 1;
    } while (pTVar5 != (TestObject *)0x0);
  }
  local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"count","expected.size()",&local_60,(unsigned_long *)&local_68);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (sStack_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((sStack_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-intrusive-list.cc"
               ,0xa6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
LAB_001e1491:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(puVar4);
  this_00 = (IntrusiveListIteratorTest *)(local_40->super_IntrusiveListIteratorTest).clist_;
  piVar1 = (intrusive_list<(anonymous_namespace)::TestObject> *)
           (this_00->super_IntrusiveListTest).super_Test._vptr_Test;
  local_58 = (undefined8 *)0x0;
  sStack_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  puVar4 = (undefined8 *)operator_new(0xc);
  sStack_50.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)puVar4 + 0xc);
  *puVar4 = &DAT_200000001;
  *(undefined4 *)(puVar4 + 1) = 3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_58;
  first.node_ = (TestObject *)this_00;
  first.list_ = piVar1;
  local_58 = puVar4;
  local_48 = sStack_50.ptr_;
  anon_unknown.dwarf_7b76a::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (this_00,first,(const_iterator)(auVar2 << 0x40),in_R9);
  operator_delete(puVar4);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_forward) {
  TestForward(list_.begin(), list_.end(), {1, 2, 3});
  TestForward(clist_.begin(), clist_.end(), {1, 2, 3});
}